

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

ptr<asio_service> nuraft::nuraft_global_mgr::get_asio_service(void)

{
  nuraft_global_mgr *pnVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  element_type *in_RDI;
  ptr<asio_service> pVar3;
  lock_guard<std::mutex> l;
  nuraft_global_mgr *mgr;
  element_type *this;
  
  this = in_RDI;
  pnVar1 = get_instance();
  if (pnVar1 == (nuraft_global_mgr *)0x0) {
    std::shared_ptr<nuraft::asio_service>::shared_ptr
              ((shared_ptr<nuraft::asio_service> *)this,in_RDI);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)this,(mutex_type *)in_RDI);
    std::shared_ptr<nuraft::asio_service>::shared_ptr
              ((shared_ptr<nuraft::asio_service> *)this,(shared_ptr<nuraft::asio_service> *)in_RDI);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x244511);
    _Var2._M_pi = extraout_RDX_00;
  }
  pVar3.super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  pVar3.super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr<asio_service>)
         pVar3.super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<asio_service> nuraft_global_mgr::get_asio_service() {
    // NOTE:
    //   Basic assumption is that this function is not called frequently,
    //   only once at the initialization time. Hence it is ok to acquire
    //   lock for a such read-only operation.
    nuraft_global_mgr* mgr = get_instance();
    if (!mgr) return nullptr;

    std::lock_guard<std::mutex> l(mgr->asio_service_lock_);
    return mgr->asio_service_;
}